

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O1

bool __thiscall
glcts::GeometryShaderPrimitiveCounter::checkResult(GeometryShaderPrimitiveCounter *this,GLint *data)

{
  ostringstream *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if ((this->m_testConfiguration).m_numberOfDrawnPrimitives == 0) {
    bVar1 = true;
  }
  else {
    this_00 = (ostringstream *)(local_1b0 + 8);
    bVar1 = true;
    local_1c0 = 1;
    uVar2 = 0;
    do {
      iVar5 = this->m_maxGeometryOutputVertices * this->m_nrVaryings;
      uVar4 = (ulong)(iVar5 * uVar2);
      uVar3 = uVar2 + 1;
      if (iVar5 * uVar2 < iVar5 * uVar3) {
        do {
          if (data[uVar4] != uVar2) {
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Rendered value at index ",0x18);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"/",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]: ",3);
            std::ostream::operator<<(this_00,data[uVar4]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," != ",4);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            bVar1 = false;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)(iVar5 * local_1c0) != uVar4);
      }
      local_1c0 = local_1c0 + 1;
      uVar2 = uVar3;
    } while (uVar3 < (this->m_testConfiguration).m_numberOfDrawnPrimitives);
  }
  return bVar1;
}

Assistant:

bool GeometryShaderPrimitiveCounter::checkResult(const glw::GLint* data)
{
	bool testPassed = true;

	for (unsigned int nDrawnPrimitive = 0; nDrawnPrimitive < m_testConfiguration.m_numberOfDrawnPrimitives;
		 nDrawnPrimitive++)
	{
		unsigned int nEmittedValuesPerPrimitive = m_maxGeometryOutputVertices * m_nrVaryings;

		for (unsigned int nValue = (nEmittedValuesPerPrimitive * (nDrawnPrimitive));
			 nValue < (nEmittedValuesPerPrimitive * (nDrawnPrimitive + 1)); nValue++)
		{
			if ((unsigned int)data[nValue] != nDrawnPrimitive)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Rendered value at index "
								   << "[" << nValue << "/" << (m_testConfiguration.m_numberOfDrawnPrimitives *
															   m_maxGeometryOutputVertices * m_nrVaryings)
								   << "]: " << data[nValue] << " != " << nEmittedValuesPerPrimitive
								   << tcu::TestLog::EndMessage;

				testPassed = false;
			}
		} /* for (all values) */
	}	 /* for (all primitives) */

	return testPassed;
}